

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsestream.h
# Opt level: O2

Vec3fa __thiscall embree::ParseStream::getVec3fa(ParseStream *this)

{
  RefCount RVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *in_RSI;
  Vec3fa VVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::get
            (&local_38,in_RSI);
  dVar2 = atof(local_38._M_dataplus._M_p);
  VVar5.field_0._0_4_ = (float)dVar2;
  std::__cxx11::string::~string((string *)&local_38);
  Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::get
            (&local_38,in_RSI);
  dVar3 = atof(local_38._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_38);
  Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::get
            (&local_38,in_RSI);
  dVar4 = atof(local_38._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_38);
  VVar5.field_0.m128[3] = (float)(int)((ulong)dVar2 >> 0x20);
  VVar5.field_0.m128[2] = VVar5.field_0._0_4_;
  RVar1._vptr_RefCount._4_4_ = (float)dVar3;
  RVar1._vptr_RefCount._0_4_ = VVar5.field_0._0_4_;
  RVar1.refCounter.super___atomic_base<unsigned_long>._M_i._0_4_ = (float)dVar4;
  RVar1.refCounter.super___atomic_base<unsigned_long>._M_i._4_4_ = 0;
  (this->
  super_Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>).
  super_RefCount = RVar1;
  VVar5.field_0.m128[1] = (float)dVar3;
  return (Vec3fa)VVar5.field_0;
}

Assistant:

Vec3fa getVec3fa() {
      float x = (float)atof(get().c_str());
      float y = (float)atof(get().c_str());
      float z = (float)atof(get().c_str());
      return Vec3fa(x,y,z);
    }